

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DepthRangeAPI::iterateHelper<float>(DepthRangeAPI *this,float *param_1)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLint j;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  GLint i;
  long lVar9;
  bool test_result;
  GLint max_viewports;
  DepthFuncWrapper depthFunc;
  vector<float,_std::allocator<float>_> depth_range_data_b;
  vector<float,_std::allocator<float>_> depth_range_data_a;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  depthFunc.m_gl = (Functions *)CONCAT44(extraout_var_00,iVar3);
  test_result = true;
  max_viewports = 0;
  (**(code **)(lVar5 + 0x868))(0x825b,&max_viewports);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x881);
  depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&depth_range_data_a,(ulong)(uint)(max_viewports * 2));
  std::vector<float,_std::allocator<float>_>::resize
            (&depth_range_data_b,(ulong)(uint)(max_viewports * 2));
  getDepthRanges<float>(this,&depthFunc,max_viewports,&depth_range_data_a);
  uVar6 = 0;
  uVar8 = 0;
  if (0 < max_viewports) {
    uVar8 = (ulong)(uint)max_viewports;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    *(ulong *)(depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6 * 2) =
         CONCAT44((float)((ulong)*(undefined8 *)
                                  (depth_range_data_a.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar6 * 2) >> 0x20) + -0.125,
                  (float)*(undefined8 *)
                          (depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar6 * 2) + 0.125);
  }
  (*(depthFunc.m_gl)->depthRangeArrayfvOES)
            (0,max_viewports,
             depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"depthRangeArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x897);
  getDepthRanges<float>(this,&depthFunc,max_viewports,&depth_range_data_b);
  compareDepthRanges<float>
            (this,&depth_range_data_a,&depth_range_data_b,"depthRangeArray",&test_result);
  for (lVar9 = 0; lVar9 < max_viewports; lVar9 = lVar9 + 1) {
    (depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start + lVar9 * 2)[0] = 0.25;
    (depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start + lVar9 * 2)[1] = 0.75;
    (*(depthFunc.m_gl)->depthRangeIndexedfOES)((GLuint)lVar9,0.25,0.75);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"depthRangeIndexed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8a7);
    getDepthRanges<float>(this,&depthFunc,max_viewports,&depth_range_data_a);
    compareDepthRanges<float>
              (this,&depth_range_data_a,&depth_range_data_b,"depthRangeIndexed",&test_result);
  }
  uVar6 = 3;
  uVar8 = 0;
  while ((long)uVar8 < (long)max_viewports) {
    fVar1 = *(float *)(&DAT_017d5b78 + (ulong)((uVar8 & 1) == 0) * 4);
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7 * 2] = fVar1;
      depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7 * 2 + 1] = fVar1;
    }
    uVar8 = uVar8 + 1;
    iVar3 = (int)uVar6;
    for (uVar7 = uVar8 & 0xffffffff; (int)uVar7 < max_viewports; uVar7 = (ulong)((int)uVar7 + 1)) {
      depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[(int)uVar6 - 1] = fVar1;
      depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = fVar1;
      uVar6 = (ulong)((int)uVar6 + 2);
    }
    (*(depthFunc.m_gl)->depthRangeArrayfvOES)
              (0,max_viewports,
               depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"depthRangeArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8c3);
    getDepthRanges<float>(this,&depthFunc,max_viewports,&depth_range_data_a);
    uVar6 = (ulong)(iVar3 + 2);
    compareDepthRanges<float>
              (this,&depth_range_data_a,&depth_range_data_b,"depthRangeArray",&test_result);
  }
  uVar6 = 0;
  uVar8 = 0;
  if (0 < max_viewports) {
    uVar8 = (ulong)(uint)max_viewports;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    (depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start + uVar6 * 2)[0] = 0.0;
    (depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start + uVar6 * 2)[1] = 1.0;
  }
  (*(depthFunc.m_gl)->depthRangef)(0.0,1.0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"depthRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x8d4);
  getDepthRanges<float>(this,&depthFunc,max_viewports,&depth_range_data_b);
  compareDepthRanges<float>(this,&depth_range_data_a,&depth_range_data_b,"depthRange",&test_result);
  bVar2 = test_result;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&depth_range_data_a.super__Vector_base<float,_std::allocator<float>_>);
  return bVar2;
}

Assistant:

bool DepthRangeAPI::iterateHelper(T*)
{
	/* GL entry points */
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();
	Utils::DepthFuncWrapper depthFunc(m_context);

	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<T> depth_range_data_a;
	std::vector<T> depth_range_data_b;

	depth_range_data_a.resize(max_viewports * m_n_elements);
	depth_range_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial values of DEPTH_RANGE for all MAX_VIEWPORTS indices;
	 *   - change values of all indices at once with DepthRangeArrayv;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	getDepthRanges(depthFunc, max_viewports, depth_range_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] += 0.125;
		depth_range_data_a[i * m_n_elements + 1] -= 0.125;
	}

	depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);

	/*
	 *   - for each index:
	 *     * modify with DepthRangeIndexed,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_b[i * m_n_elements + 0] = 0.25;
		depth_range_data_b[i * m_n_elements + 1] = 0.75;

		depthFunc.depthRangeIndexed(i, (T)0.25, (T)0.75);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeIndexed");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with DepthRangeArrayv,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const T value = (0 == i % 2) ? T(1.0) : T(0.25);

		for (GLint j = 0; j < i; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);
	}

	/*
	 *   - change values of all indices at once with DepthRange;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] = 0.0f;
		depth_range_data_a[i * m_n_elements + 1] = 1.0f;
	}

	depthFunc.depthRange((T)0.0, (T)1.0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRange");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRange", test_result);

	return test_result;
}